

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

void __thiscall
spirv_cross::SmallVector<CLIArguments::Rename,_8UL>::push_back
          (SmallVector<CLIArguments::Rename,_8UL> *this,Rename *t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t *psVar3;
  Rename *pRVar4;
  Rename *pRVar5;
  size_t sVar6;
  pointer pcVar7;
  size_type sVar8;
  undefined8 uVar9;
  
  reserve(this,(this->super_VectorView<CLIArguments::Rename>).buffer_size + 1);
  pRVar5 = (this->super_VectorView<CLIArguments::Rename>).ptr;
  sVar6 = (this->super_VectorView<CLIArguments::Rename>).buffer_size;
  pRVar4 = pRVar5 + sVar6;
  paVar2 = &pRVar5[sVar6].old_name.field_2;
  (&paVar2->_M_allocated_capacity)[-2] = (size_type)paVar2;
  pcVar7 = (t->old_name)._M_dataplus._M_p;
  paVar1 = &(t->old_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar7 == paVar1) {
    sVar8 = *(size_type *)((long)&(t->old_name).field_2 + 8);
    paVar2->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    (&paVar2->_M_allocated_capacity)[1] = sVar8;
  }
  else {
    (pRVar4->old_name)._M_dataplus._M_p = pcVar7;
    (pRVar4->old_name).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (pRVar4->old_name)._M_string_length = (t->old_name)._M_string_length;
  (t->old_name)._M_dataplus._M_p = (pointer)paVar1;
  (t->old_name)._M_string_length = 0;
  (t->old_name).field_2._M_local_buf[0] = '\0';
  paVar1 = &(pRVar4->new_name).field_2;
  (pRVar4->new_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar7 = (t->new_name)._M_dataplus._M_p;
  paVar2 = &(t->new_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar7 == paVar2) {
    uVar9 = *(undefined8 *)((long)&(t->new_name).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(pRVar4->new_name).field_2 + 8) = uVar9;
  }
  else {
    (pRVar4->new_name)._M_dataplus._M_p = pcVar7;
    (pRVar4->new_name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (pRVar4->new_name)._M_string_length = (t->new_name)._M_string_length;
  (t->new_name)._M_dataplus._M_p = (pointer)paVar2;
  (t->new_name)._M_string_length = 0;
  (t->new_name).field_2._M_local_buf[0] = '\0';
  pRVar4->execution_model = t->execution_model;
  psVar3 = &(this->super_VectorView<CLIArguments::Rename>).buffer_size;
  *psVar3 = *psVar3 + 1;
  return;
}

Assistant:

void push_back(T &&t) SPIRV_CROSS_NOEXCEPT
	{
		reserve(this->buffer_size + 1);
		new (&this->ptr[this->buffer_size]) T(std::move(t));
		this->buffer_size++;
	}